

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawTestCaseUtil.hpp
# Opt level: O2

TestInstance * __thiscall
vkt::Draw::
InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
::createInstance(InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
                 *this,Context *context)

{
  IndirectDraw *this_00;
  VkPhysicalDeviceFeatures *pVVar1;
  NotSupportedError *this_01;
  allocator<char> local_b1;
  string local_b0;
  DrawTypedTestSpec local_90;
  DrawTypedTestSpec local_58;
  
  this_00 = (IndirectDraw *)operator_new(0x218);
  Draw::anon_unknown_0::DrawTypedTestSpec::DrawTypedTestSpec(&local_90,&this->m_testSpec);
  Draw::anon_unknown_0::DrawTypedTestSpec::DrawTypedTestSpec(&local_58,&local_90);
  Draw::anon_unknown_0::IndirectDraw::IndirectDraw(this_00,context,&local_58);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
               *)&local_58);
  (this_00->super_DrawTestsBaseClass).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__IndirectDraw_00c05040;
  pVVar1 = Context::getDeviceFeatures
                     ((this_00->super_DrawTestsBaseClass).super_TestInstance.m_context);
  if (pVVar1->drawIndirectFirstInstance == 1) {
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                 *)&local_90);
    return (TestInstance *)this_00;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"Required \'drawIndirectFirstInstance\' feature is not supported",
             &local_b1);
  tcu::NotSupportedError::NotSupportedError(this_01,&local_b0);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TestInstance* createInstance (Context& context) const
	{
		return new Instance(context, m_testSpec);
	}